

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O1

ReadWrite __thiscall SCSI::Target::CommandState::read_write_specs(CommandState *this)

{
  pointer puVar1;
  uint32_t uVar2;
  long lVar3;
  ushort uVar4;
  ulong uVar5;
  
  uVar2 = address(this);
  puVar1 = (this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 == 10) {
    uVar4 = *(ushort *)(puVar1 + 7) << 8 | *(ushort *)(puVar1 + 7) >> 8;
  }
  else if (lVar3 == 6) {
    uVar4 = (ushort)puVar1[4];
  }
  else {
    uVar4 = 0;
  }
  uVar5 = (ulong)(lVar3 == 6) << 8;
  if (uVar4 != 0) {
    uVar5 = (ulong)uVar4;
  }
  return (ReadWrite)((ulong)uVar2 | uVar5 << 0x20);
}

Assistant:

CommandState::ReadWrite CommandState::read_write_specs() const {
	ReadWrite specs;

	specs.address = address();
	specs.number_of_blocks = number_of_blocks();
	if(!specs.number_of_blocks && (data_.size() == 6)) {
		specs.number_of_blocks = 256;
	}

	return specs;
}